

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitTryCatchAroundIteratorClose
               (RegSlot iteratorLocation,ByteCodeLabel endLabel,ByteCodeGenerator *byteCodeGenerator
               ,FuncInfo *funcInfo,bool isAsync)

{
  ByteCodeLabel labelID;
  RegSlot R0;
  ByteCodeWriter *pBVar1;
  RegSlot catchParamLocation;
  ByteCodeLabel catchLabel;
  bool isAsync_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ByteCodeLabel endLabel_local;
  RegSlot iteratorLocation_local;
  
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  labelID = Js::ByteCodeWriter::DefineLabel(pBVar1);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Br(pBVar1,TryCatch,labelID);
  if (isAsync) {
    ByteCodeGenerator::PushJumpCleanupForTry
              (byteCodeGenerator,TryCatch,labelID,0xffffffff,0xffffffff);
  }
  EmitIteratorClose(iteratorLocation,byteCodeGenerator,funcInfo,isAsync);
  if (isAsync) {
    ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  }
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Empty(pBVar1,Leave);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Br(pBVar1,endLabel);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar1,labelID);
  R0 = FuncInfo::AcquireTmpRegister(funcInfo);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Reg1(pBVar1,Catch,R0);
  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::Empty(pBVar1,Leave);
  return;
}

Assistant:

void EmitTryCatchAroundIteratorClose(
    Js::RegSlot iteratorLocation,
    Js::ByteCodeLabel endLabel,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    bool isAsync)
{
    Js::ByteCodeLabel catchLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->Br(Js::OpCode::TryCatch, catchLabel);

    // Jump cleanup is only needed in a for-await loop since it will await the
    // result of the call to the return method. Otherwise there can be no jump.
    if (isAsync)
        byteCodeGenerator->PushJumpCleanupForTry(Js::OpCode::TryCatch, catchLabel);

    EmitIteratorClose(iteratorLocation, byteCodeGenerator, funcInfo, isAsync);

    if (isAsync)
        byteCodeGenerator->PopJumpCleanup();

    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);
    byteCodeGenerator->Writer()->Br(endLabel);

    byteCodeGenerator->Writer()->MarkLabel(catchLabel);
    Js::RegSlot catchParamLocation = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg1(Js::OpCode::Catch, catchParamLocation);
    funcInfo->ReleaseTmpRegister(catchParamLocation);

    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);
}